

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.hpp
# Opt level: O1

MPI_Request * __thiscall mxx::requests::add(requests *this)

{
  pointer *pppoVar1;
  iterator __position;
  ompi_request_t *local_10;
  
  local_10 = (ompi_request_t *)0x0;
  __position._M_current =
       (this->m_requests).super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_requests).super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<ompi_request_t*,std::allocator<ompi_request_t*>>::_M_realloc_insert<ompi_request_t*>
              ((vector<ompi_request_t*,std::allocator<ompi_request_t*>> *)&this->m_requests,
               __position,&local_10);
  }
  else {
    *__position._M_current = (ompi_request_t *)0x0;
    pppoVar1 = &(this->m_requests).
                super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppoVar1 = *pppoVar1 + 1;
  }
  return (this->m_requests).super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
         _M_impl.super__Vector_impl_data._M_finish + -1;
}

Assistant:

MPI_Request& add() {
        m_requests.push_back(MPI_Request());
        return m_requests.back();
    }